

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_top_k(ggml_context *ctx,ggml_tensor *a,int k)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ggml_tensor *pgVar4;
  long local_38;
  int64_t local_30;
  int64_t iStack_28;
  int64_t local_20;
  
  if ((long)k <= a->ne[0]) {
    pgVar4 = ggml_argsort(ctx,a,GGML_SORT_ORDER_DESC);
    local_20 = pgVar4->ne[3];
    sVar1 = pgVar4->nb[3];
    local_30 = pgVar4->ne[1];
    iStack_28 = pgVar4->ne[2];
    sVar2 = pgVar4->nb[1];
    sVar3 = pgVar4->nb[2];
    local_38 = (long)k;
    pgVar4 = ggml_view_impl(ctx,pgVar4,4,&local_38,0);
    pgVar4->nb[1] = sVar2;
    pgVar4->nb[2] = sVar3;
    pgVar4->nb[3] = sVar1;
    return pgVar4;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x111e,"GGML_ASSERT(%s) failed","a->ne[0] >= k");
}

Assistant:

struct ggml_tensor * ggml_top_k(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   k) {
    GGML_ASSERT(a->ne[0] >= k);

    struct ggml_tensor * result = ggml_argsort(ctx, a, GGML_SORT_ORDER_DESC);

    result = ggml_view_4d(ctx, result,
                k, result->ne[1], result->ne[2], result->ne[3],
                   result->nb[1], result->nb[2], result->nb[3],
                0);

    return result;
}